

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O3

int y4m_input_open(y4m_input *y4m_ctx,FILE *file,char *skip_buffer,int num_skip,
                  aom_chroma_sample_position_t csp,int only_420)

{
  byte *__s1;
  byte *pbVar1;
  byte bVar2;
  aom_chroma_sample_position_t aVar3;
  int iVar4;
  uchar *__ptr;
  uchar *puVar5;
  sbyte sVar6;
  int iVar7;
  int *piVar8;
  code *pcVar9;
  int *piVar10;
  y4m_input *pyVar11;
  char *pcVar12;
  byte *pbVar13;
  char *__format;
  int iVar14;
  size_t sVar15;
  int iVar16;
  size_t sVar17;
  long lVar18;
  bool bVar19;
  char tag_buffer [9];
  char local_179;
  undefined7 uStack_178;
  char local_171;
  char *local_170;
  aom_chroma_sample_position_t local_164;
  int *local_160;
  y4m_input *local_158;
  int *local_150;
  int *local_148;
  int *local_140;
  byte local_138 [264];
  
  if (0 < num_skip) {
    memcpy(&local_179,skip_buffer,(ulong)(uint)num_skip);
  }
  iVar4 = file_read(&local_179 + num_skip,(long)(9 - num_skip),file);
  if (iVar4 == 0) {
    return -1;
  }
  if (local_171 != '2' || CONCAT71(uStack_178,local_179) != 0x4745504d34565559) {
    y4m_input_open_cold_1();
    return -1;
  }
  iVar4 = file_read(&local_179,1,file);
  if ((iVar4 == 0) || (local_179 != ' ')) {
    y4m_input_open_cold_17();
    return -1;
  }
  y4m_ctx->pic_w = -1;
  y4m_ctx->pic_h = -1;
  local_158 = (y4m_input *)&y4m_ctx->pic_h;
  local_160 = &y4m_ctx->fps_n;
  y4m_ctx->fps_n = -1;
  local_140 = &y4m_ctx->par_n;
  y4m_ctx->par_n = 0;
  y4m_ctx->par_d = 0;
  local_148 = &y4m_ctx->par_d;
  y4m_ctx->interlace = '?';
  y4m_ctx->color_range = AOM_CR_STUDIO_RANGE;
  local_170 = y4m_ctx->chroma_type;
  builtin_strncpy(y4m_ctx->chroma_type,"420",4);
  local_150 = &y4m_ctx->fps_d;
  local_164 = csp;
LAB_00122ebe:
  do {
    iVar4 = file_read(local_138,1,file);
    if (iVar4 == 0) goto LAB_00123106;
    if (local_138[0] == 10) {
      local_138[0] = 0;
      bVar19 = true;
    }
    else {
      if (local_138[0] == 0x20) goto LAB_00122ebe;
      lVar18 = 1;
      while( true ) {
        iVar4 = file_read(local_138 + lVar18,1,file);
        if (iVar4 == 0) goto LAB_00123106;
        bVar2 = local_138[lVar18];
        if ((bVar2 == 10) || (bVar2 == 0x20)) break;
        lVar18 = lVar18 + 1;
        if (lVar18 == 0x100) {
          y4m_input_open_cold_16();
          goto LAB_00123106;
        }
      }
      local_138[lVar18] = 0;
      bVar19 = bVar2 == 10;
    }
    pbVar1 = local_138;
switchD_00122f8e_caseD_42:
    while (pbVar13 = pbVar1, aVar3 = local_164, pcVar12 = local_170, bVar2 = *pbVar13, bVar2 == 0x20
          ) {
      pbVar1 = pbVar13 + 1;
    }
    if (bVar2 != 0) {
      __s1 = pbVar13 + 1;
      for (sVar17 = 0; (__s1[sVar17] & 0xdf) != 0; sVar17 = sVar17 + 1) {
      }
      pbVar1 = __s1 + sVar17;
      switch(bVar2) {
      case 0x41:
        piVar8 = local_148;
        piVar10 = local_140;
        break;
      case 0x42:
      case 0x44:
      case 0x45:
      case 0x47:
        goto switchD_00122f8e_caseD_42;
      case 0x43:
        if (0x10 < (long)(sVar17 + 1)) goto LAB_00123106;
        memcpy(local_170,__s1,sVar17);
        y4m_ctx->chroma_type[sVar17] = '\0';
        goto switchD_00122f8e_caseD_42;
      case 0x46:
        piVar8 = local_150;
        piVar10 = local_160;
        break;
      case 0x48:
        pyVar11 = local_158;
        goto LAB_0012308c;
      case 0x49:
        y4m_ctx->interlace = *__s1;
        goto switchD_00122f8e_caseD_42;
      default:
        pyVar11 = y4m_ctx;
        if (bVar2 == 0x57) {
LAB_0012308c:
          iVar4 = __isoc99_sscanf(__s1,"%d",pyVar11);
          if (iVar4 != 1) goto LAB_00123106;
        }
        else if ((bVar2 == 0x58) && (iVar4 = strncmp((char *)__s1,"COLORRANGE=",0xb), iVar4 == 0)) {
          pbVar13 = pbVar13 + 0xc;
          iVar4 = strcmp((char *)pbVar13,"LIMITED");
          if (iVar4 != 0) {
            iVar4 = strcmp((char *)pbVar13,"FULL");
            if (iVar4 != 0) {
              fprintf(_stderr,"Unknown color range value: %s\n",pbVar13);
              goto LAB_00123106;
            }
            y4m_ctx->color_range = AOM_CR_FULL_RANGE;
          }
        }
        goto switchD_00122f8e_caseD_42;
      }
      iVar4 = __isoc99_sscanf(__s1,"%d:%d",piVar10,piVar8);
      if (iVar4 != 2) goto LAB_00123106;
      goto switchD_00122f8e_caseD_42;
    }
  } while (!bVar19);
  if (y4m_ctx->pic_w == -1) {
    y4m_input_open_cold_15();
  }
  else if (local_158->pic_w == -1) {
    y4m_input_open_cold_14();
  }
  else {
    if (*local_160 != -1) {
      if (y4m_ctx->interlace != 'p') {
        if (y4m_ctx->interlace != '?') {
          y4m_input_open_cold_12();
          return -1;
        }
        y4m_input_open_cold_2();
      }
      if (aVar3 == AOM_CSP_VERTICAL) {
        iVar4 = strcmp(pcVar12,"420mpeg2");
        if (iVar4 != 0) {
          y4m_input_open_cold_4();
          return -1;
        }
      }
      else if (aVar3 == AOM_CSP_COLOCATED) {
        y4m_input_open_cold_3();
      }
      y4m_ctx->aom_fmt = AOM_IMG_FMT_I420;
      y4m_ctx->bps = 0xc;
      y4m_ctx->bit_depth = 8;
      y4m_ctx->dst_buf = (uchar *)0x0;
      y4m_ctx->aux_buf = (uchar *)0x0;
      iVar4 = strcmp(pcVar12,"420");
      if (((iVar4 == 0) || (iVar4 = strcmp(pcVar12,"420jpeg"), iVar4 == 0)) ||
         (iVar4 = strcmp(pcVar12,"420mpeg2"), iVar4 == 0)) {
        y4m_ctx->src_c_dec_h = 2;
        y4m_ctx->src_c_dec_v = 2;
        y4m_ctx->dst_c_dec_h = 2;
        y4m_ctx->dst_c_dec_v = 2;
        iVar4 = y4m_ctx->pic_w;
        iVar14 = y4m_ctx->pic_h;
        y4m_ctx->dst_buf_read_sz =
             (long)(int)(iVar14 * iVar4 +
                        ((iVar14 - (iVar14 + 1 >> 0x1f)) + 1U >> 1) *
                        ((iVar4 - (iVar4 + 1 >> 0x1f)) + 1U >> 1) * 2);
        y4m_ctx->aux_buf_sz = 0;
        y4m_ctx->aux_buf_read_sz = 0;
        pcVar9 = y4m_convert_null;
LAB_00123362:
        y4m_ctx->convert = pcVar9;
        sVar17 = 0;
LAB_0012336e:
        sVar6 = 0;
      }
      else {
        iVar4 = strcmp(pcVar12,"420p10");
        if (iVar4 == 0) {
          y4m_ctx->src_c_dec_h = 2;
          y4m_ctx->src_c_dec_v = 2;
          y4m_ctx->dst_c_dec_h = 2;
          y4m_ctx->dst_c_dec_v = 2;
          iVar4 = y4m_ctx->pic_w;
          iVar14 = y4m_ctx->pic_h;
          y4m_ctx->dst_buf_read_sz =
               (long)(int)((iVar14 * iVar4 +
                           ((iVar14 - (iVar14 + 1 >> 0x1f)) + 1U >> 1) *
                           ((iVar4 - (iVar4 + 1 >> 0x1f)) + 1U >> 1) * 2) * 2);
          y4m_ctx->aux_buf_sz = 0;
          y4m_ctx->aux_buf_read_sz = 0;
          y4m_ctx->convert = y4m_convert_null;
          y4m_ctx->bit_depth = 10;
          y4m_ctx->aom_fmt = AOM_IMG_FMT_I42016;
          y4m_ctx->bps = 0xf;
          if (only_420 != 0) {
            y4m_input_open_cold_11();
            return -1;
          }
        }
        else {
          iVar4 = strcmp(pcVar12,"420p12");
          if (iVar4 != 0) {
            iVar4 = strcmp(pcVar12,"420paldv");
            if (iVar4 == 0) {
              y4m_ctx->src_c_dec_h = 2;
              y4m_ctx->src_c_dec_v = 2;
              y4m_ctx->dst_c_dec_h = 2;
              y4m_ctx->dst_c_dec_v = 2;
              iVar4 = y4m_ctx->pic_w;
              iVar14 = y4m_ctx->pic_h;
              y4m_ctx->dst_buf_read_sz = (long)(iVar14 * iVar4);
              iVar7 = ((iVar14 - (iVar14 + 1 >> 0x1f)) + 1 >> 1) *
                      ((iVar4 - (iVar4 + 1 >> 0x1f)) + 1 >> 1);
              sVar17 = (size_t)(iVar7 * 3);
              y4m_ctx->aux_buf_sz = sVar17;
              y4m_ctx->aux_buf_read_sz = (long)(iVar7 * 2);
              pcVar9 = y4m_convert_42xpaldv_42xjpeg;
            }
            else {
              iVar4 = strcmp(pcVar12,"422jpeg");
              if (iVar4 == 0) {
                y4m_ctx->src_c_dec_h = 2;
                y4m_ctx->src_c_dec_v = 1;
                y4m_ctx->dst_c_dec_h = 2;
                y4m_ctx->dst_c_dec_v = 2;
                iVar4 = y4m_ctx->pic_w;
                iVar14 = y4m_ctx->pic_h;
                y4m_ctx->dst_buf_read_sz = (long)(iVar14 * iVar4);
                sVar17 = (size_t)(int)(((iVar4 - (iVar4 + 1 >> 0x1f)) + 1U >> 1) * iVar14 * 2);
                y4m_ctx->aux_buf_read_sz = sVar17;
                y4m_ctx->aux_buf_sz = sVar17;
                pcVar9 = y4m_convert_422jpeg_420jpeg;
              }
              else {
                iVar4 = strcmp(pcVar12,"422");
                if (iVar4 != 0) {
                  iVar4 = strcmp(pcVar12,"422p10");
                  if (iVar4 == 0) {
                    y4m_ctx->aom_fmt = AOM_IMG_FMT_I42216;
                    y4m_ctx->bps = 0x14;
                    y4m_ctx->bit_depth = 10;
                    y4m_ctx->src_c_dec_h = 2;
                    y4m_ctx->src_c_dec_v = 1;
                    y4m_ctx->dst_c_dec_h = 2;
                    y4m_ctx->dst_c_dec_v = 1;
                    iVar4 = y4m_ctx->pic_w;
                    iVar14 = y4m_ctx->pic_h;
                    y4m_ctx->dst_buf_read_sz =
                         (long)(int)((((iVar4 - (iVar4 + 1 >> 0x1f)) + 1U & 0x7ffffffe) + iVar4) *
                                     iVar14 * 2);
                    y4m_ctx->aux_buf_sz = 0;
                    y4m_ctx->aux_buf_read_sz = 0;
                    y4m_ctx->convert = y4m_convert_null;
                    if (only_420 != 0) {
                      y4m_input_open_cold_9();
                      return -1;
                    }
                  }
                  else {
                    iVar4 = strcmp(pcVar12,"422p12");
                    if (iVar4 != 0) {
                      iVar4 = strcmp(pcVar12,"411");
                      if (iVar4 != 0) {
                        iVar4 = strcmp(pcVar12,"444");
                        if (iVar4 == 0) {
                          y4m_ctx->src_c_dec_h = 1;
                          y4m_ctx->src_c_dec_v = 1;
                          if (only_420 != 0) {
                            y4m_ctx->dst_c_dec_h = 2;
                            y4m_ctx->dst_c_dec_v = 2;
                            iVar4 = y4m_ctx->pic_w;
                            iVar14 = y4m_ctx->pic_h;
                            y4m_ctx->dst_buf_read_sz = (long)(iVar14 * iVar4);
                            sVar15 = (size_t)(iVar14 * iVar4 * 2);
                            y4m_ctx->aux_buf_read_sz = sVar15;
                            sVar17 = (long)(((iVar4 - (iVar4 + 1 >> 0x1f)) + 1 >> 1) * iVar14) +
                                     sVar15;
LAB_001239d1:
                            y4m_ctx->aux_buf_sz = sVar17;
                            pcVar9 = y4m_convert_444_420jpeg;
                            goto LAB_001239dc;
                          }
                          y4m_ctx->aom_fmt = AOM_IMG_FMT_I444;
                          y4m_ctx->bps = 0x18;
                          y4m_ctx->dst_c_dec_h = 1;
                          y4m_ctx->dst_c_dec_v = 1;
                          iVar4 = y4m_ctx->pic_w;
                          iVar14 = y4m_ctx->pic_h;
                          y4m_ctx->dst_buf_read_sz = (long)(iVar4 * iVar14 * 3);
                          y4m_ctx->aux_buf_sz = 0;
                          y4m_ctx->aux_buf_read_sz = 0;
                          y4m_ctx->convert = y4m_convert_null;
                          sVar6 = 0;
                        }
                        else {
                          iVar4 = strcmp(pcVar12,"444p10");
                          if (iVar4 == 0) {
                            y4m_ctx->aom_fmt = AOM_IMG_FMT_I44416;
                            y4m_ctx->bps = 0x1e;
                            y4m_ctx->bit_depth = 10;
                            y4m_ctx->src_c_dec_h = 1;
                            y4m_ctx->src_c_dec_v = 1;
                            y4m_ctx->dst_c_dec_h = 1;
                            y4m_ctx->dst_c_dec_v = 1;
                            iVar4 = y4m_ctx->pic_w;
                            iVar14 = y4m_ctx->pic_h;
                            y4m_ctx->dst_buf_read_sz = (long)(iVar4 * iVar14 * 6);
                            y4m_ctx->aux_buf_sz = 0;
                            y4m_ctx->aux_buf_read_sz = 0;
                            y4m_ctx->convert = y4m_convert_null;
                            if (only_420 != 0) {
                              y4m_input_open_cold_7();
                              return -1;
                            }
                          }
                          else {
                            iVar4 = strcmp(pcVar12,"444p12");
                            if (iVar4 != 0) {
                              iVar4 = strcmp(pcVar12,"444alpha");
                              if (iVar4 != 0) {
                                iVar4 = strcmp(pcVar12,"mono");
                                if (iVar4 != 0) {
                                  __format = "Unknown chroma sampling type: %s\n";
                                  pcVar12 = local_170;
                                  goto LAB_0012311e;
                                }
                                y4m_ctx->src_c_dec_h = 0;
                                y4m_ctx->src_c_dec_v = 0;
                                y4m_ctx->dst_c_dec_h = 2;
                                y4m_ctx->dst_c_dec_v = 2;
                                iVar4 = y4m_ctx->pic_w;
                                iVar14 = y4m_ctx->pic_h;
                                y4m_ctx->dst_buf_read_sz = (long)(iVar14 * iVar4);
                                y4m_ctx->aux_buf_sz = 0;
                                y4m_ctx->aux_buf_read_sz = 0;
                                pcVar9 = y4m_convert_mono_420jpeg;
                                goto LAB_00123362;
                              }
                              y4m_ctx->src_c_dec_h = 1;
                              y4m_ctx->src_c_dec_v = 1;
                              if (only_420 == 0) {
                                y4m_input_open_cold_5();
                                return -1;
                              }
                              y4m_ctx->dst_c_dec_h = 2;
                              y4m_ctx->dst_c_dec_v = 2;
                              iVar4 = y4m_ctx->pic_w;
                              iVar14 = y4m_ctx->pic_h;
                              y4m_ctx->dst_buf_read_sz = (long)(iVar14 * iVar4);
                              sVar17 = (size_t)(iVar14 * iVar4 * 3);
                              y4m_ctx->aux_buf_read_sz = sVar17;
                              goto LAB_001239d1;
                            }
                            y4m_ctx->aom_fmt = AOM_IMG_FMT_I44416;
                            y4m_ctx->bps = 0x24;
                            y4m_ctx->bit_depth = 0xc;
                            y4m_ctx->src_c_dec_h = 1;
                            y4m_ctx->src_c_dec_v = 1;
                            y4m_ctx->dst_c_dec_h = 1;
                            y4m_ctx->dst_c_dec_v = 1;
                            iVar4 = y4m_ctx->pic_w;
                            iVar14 = y4m_ctx->pic_h;
                            y4m_ctx->dst_buf_read_sz = (long)(iVar4 * iVar14 * 6);
                            y4m_ctx->aux_buf_sz = 0;
                            y4m_ctx->aux_buf_read_sz = 0;
                            y4m_ctx->convert = y4m_convert_null;
                            if (only_420 != 0) {
                              y4m_input_open_cold_6();
                              return -1;
                            }
                          }
                          sVar6 = 1;
                        }
                        sVar17 = 0;
                        iVar16 = 1;
                        iVar7 = 1;
                        goto LAB_00123375;
                      }
                      y4m_ctx->src_c_dec_h = 4;
                      y4m_ctx->src_c_dec_v = 1;
                      y4m_ctx->dst_c_dec_h = 2;
                      y4m_ctx->dst_c_dec_v = 2;
                      iVar4 = y4m_ctx->pic_w;
                      iVar14 = y4m_ctx->pic_h;
                      y4m_ctx->dst_buf_read_sz = (long)(iVar14 * iVar4);
                      iVar7 = iVar4 + 6;
                      if (-1 < iVar4 + 3) {
                        iVar7 = iVar4 + 3;
                      }
                      sVar15 = (size_t)((iVar7 >> 2) * iVar14 * 2);
                      y4m_ctx->aux_buf_read_sz = sVar15;
                      sVar17 = (long)(((iVar4 - (iVar4 + 1 >> 0x1f)) + 1 >> 1) * iVar14) + sVar15;
                      y4m_ctx->aux_buf_sz = sVar17;
                      pcVar9 = y4m_convert_411_420jpeg;
                      goto LAB_001239dc;
                    }
                    y4m_ctx->aom_fmt = AOM_IMG_FMT_I42216;
                    y4m_ctx->bps = 0x18;
                    y4m_ctx->bit_depth = 0xc;
                    y4m_ctx->src_c_dec_h = 2;
                    y4m_ctx->src_c_dec_v = 1;
                    y4m_ctx->dst_c_dec_h = 2;
                    y4m_ctx->dst_c_dec_v = 1;
                    iVar4 = y4m_ctx->pic_w;
                    iVar14 = y4m_ctx->pic_h;
                    y4m_ctx->dst_buf_read_sz =
                         (long)(int)((((iVar4 - (iVar4 + 1 >> 0x1f)) + 1U & 0x7ffffffe) + iVar4) *
                                     iVar14 * 2);
                    y4m_ctx->aux_buf_sz = 0;
                    y4m_ctx->aux_buf_read_sz = 0;
                    y4m_ctx->convert = y4m_convert_null;
                    if (only_420 != 0) {
                      y4m_input_open_cold_8();
                      return -1;
                    }
                  }
                  iVar7 = 2;
                  iVar16 = 1;
                  sVar6 = 1;
                  sVar17 = 0;
                  goto LAB_00123375;
                }
                y4m_ctx->src_c_dec_h = 2;
                y4m_ctx->src_c_dec_v = 1;
                if (only_420 == 0) {
                  y4m_ctx->aom_fmt = AOM_IMG_FMT_I422;
                  y4m_ctx->bps = 0x10;
                  y4m_ctx->dst_c_dec_h = 2;
                  y4m_ctx->dst_c_dec_v = 1;
                  iVar4 = y4m_ctx->pic_w;
                  iVar14 = y4m_ctx->pic_h;
                  y4m_ctx->dst_buf_read_sz =
                       (long)(int)((((iVar4 - (iVar4 + 1 >> 0x1f)) + 1U & 0xfffffffe) + iVar4) *
                                  iVar14);
                  y4m_ctx->aux_buf_sz = 0;
                  y4m_ctx->aux_buf_read_sz = 0;
                  y4m_ctx->convert = y4m_convert_null;
                  iVar7 = 2;
                  iVar16 = 1;
                  sVar17 = 0;
                  sVar6 = 0;
                  goto LAB_00123375;
                }
                y4m_ctx->dst_c_dec_h = 2;
                y4m_ctx->dst_c_dec_v = 2;
                iVar4 = y4m_ctx->pic_w;
                iVar14 = y4m_ctx->pic_h;
                y4m_ctx->dst_buf_read_sz = (long)(iVar14 * iVar4);
                iVar7 = ((iVar4 - (iVar4 + 1 >> 0x1f)) + 1 >> 1) * iVar14;
                sVar15 = (size_t)(iVar7 * 2);
                y4m_ctx->aux_buf_read_sz = sVar15;
                sVar17 = (long)iVar7 + sVar15;
                y4m_ctx->aux_buf_sz = sVar17;
                pcVar9 = y4m_convert_422_420jpeg;
              }
            }
LAB_001239dc:
            y4m_ctx->convert = pcVar9;
            goto LAB_0012336e;
          }
          y4m_ctx->src_c_dec_h = 2;
          y4m_ctx->src_c_dec_v = 2;
          y4m_ctx->dst_c_dec_h = 2;
          y4m_ctx->dst_c_dec_v = 2;
          iVar4 = y4m_ctx->pic_w;
          iVar14 = y4m_ctx->pic_h;
          y4m_ctx->dst_buf_read_sz =
               (long)(int)((iVar14 * iVar4 +
                           ((iVar14 - (iVar14 + 1 >> 0x1f)) + 1U >> 1) *
                           ((iVar4 - (iVar4 + 1 >> 0x1f)) + 1U >> 1) * 2) * 2);
          y4m_ctx->aux_buf_sz = 0;
          y4m_ctx->aux_buf_read_sz = 0;
          y4m_ctx->convert = y4m_convert_null;
          y4m_ctx->bit_depth = 0xc;
          y4m_ctx->aom_fmt = AOM_IMG_FMT_I42016;
          y4m_ctx->bps = 0x12;
          if (only_420 != 0) {
            y4m_input_open_cold_10();
            return -1;
          }
        }
        sVar6 = 1;
        sVar17 = 0;
      }
      iVar16 = 2;
      iVar7 = 2;
LAB_00123375:
      sVar15 = (size_t)(iVar14 * iVar4 +
                       ((iVar14 + iVar16 + -1) / iVar16) * ((iVar4 + iVar7 + -1) / iVar7) * 2);
      y4m_ctx->dst_buf_sz = sVar15;
      __ptr = (uchar *)malloc(sVar15 << sVar6);
      y4m_ctx->dst_buf = __ptr;
      if (__ptr == (uchar *)0x0) {
        return -1;
      }
      if (sVar17 != 0) {
        puVar5 = (uchar *)malloc(sVar17);
        y4m_ctx->aux_buf = puVar5;
        if (puVar5 == (uchar *)0x0) {
          free(__ptr);
          return -1;
        }
        return 0;
      }
      return 0;
    }
    y4m_input_open_cold_13();
  }
LAB_00123106:
  __format = "Error parsing %s header.\n";
  pcVar12 = "YUV4MPEG2";
LAB_0012311e:
  fprintf(_stderr,__format,pcVar12);
  return -1;
}

Assistant:

int y4m_input_open(y4m_input *y4m_ctx, FILE *file, char *skip_buffer,
                   int num_skip, aom_chroma_sample_position_t csp,
                   int only_420) {
  // File must start with |TAG|.
  char tag_buffer[9];  // 9 == strlen(TAG)
  // Read as much as possible from |skip_buffer|, which were characters
  // that were previously read from the file to do input-type detection.
  assert(num_skip >= 0 && num_skip <= 8);
  if (num_skip > 0) {
    memcpy(tag_buffer, skip_buffer, num_skip);
  }
  // Start reading from the file now that the |skip_buffer| is depleted.
  if (!file_read(tag_buffer + num_skip, 9 - num_skip, file)) {
    return -1;
  }
  if (memcmp(TAG, tag_buffer, 9) != 0) {
    fprintf(stderr, "Error parsing header: must start with %s\n", TAG);
    return -1;
  }
  // Next character must be a space.
  if (!file_read(tag_buffer, 1, file) || tag_buffer[0] != ' ') {
    fprintf(stderr, "Error parsing header: space must follow %s\n", TAG);
    return -1;
  }
  if (!parse_tags(y4m_ctx, file)) {
    fprintf(stderr, "Error parsing %s header.\n", TAG);
    return -1;
  }
  if (y4m_ctx->interlace == '?') {
    fprintf(stderr,
            "Warning: Input video interlacing format unknown; "
            "assuming progressive scan.\n");
  } else if (y4m_ctx->interlace != 'p') {
    fprintf(stderr,
            "Input video is interlaced; "
            "Only progressive scan handled.\n");
    return -1;
  }
  /* Only support vertical chroma sample position if the input format is
   * already 420mpeg2. Colocated is not supported in Y4M.
   */
  if (csp == AOM_CSP_VERTICAL &&
      strcmp(y4m_ctx->chroma_type, "420mpeg2") != 0) {
    fprintf(stderr,
            "Vertical chroma sample position only supported "
            "for 420mpeg2 input\n");
    return -1;
  }
  if (csp == AOM_CSP_COLOCATED) {
    // TODO(any): check the right way to handle this in y4m
    fprintf(stderr,
            "Ignoring colocated chroma sample position for reading in Y4M\n");
  }
  y4m_ctx->aom_fmt = AOM_IMG_FMT_I420;
  y4m_ctx->bps = 12;
  y4m_ctx->bit_depth = 8;
  y4m_ctx->aux_buf = NULL;
  y4m_ctx->dst_buf = NULL;
  if (strcmp(y4m_ctx->chroma_type, "420") == 0 ||
      strcmp(y4m_ctx->chroma_type, "420jpeg") == 0 ||
      strcmp(y4m_ctx->chroma_type, "420mpeg2") == 0) {
    y4m_ctx->src_c_dec_h = y4m_ctx->dst_c_dec_h = y4m_ctx->src_c_dec_v =
        y4m_ctx->dst_c_dec_v = 2;
    y4m_ctx->dst_buf_read_sz =
        y4m_ctx->pic_w * y4m_ctx->pic_h +
        2 * ((y4m_ctx->pic_w + 1) / 2) * ((y4m_ctx->pic_h + 1) / 2);
    /* Natively supported: no conversion required. */
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_null;
  } else if (strcmp(y4m_ctx->chroma_type, "420p10") == 0) {
    y4m_ctx->src_c_dec_h = 2;
    y4m_ctx->dst_c_dec_h = 2;
    y4m_ctx->src_c_dec_v = 2;
    y4m_ctx->dst_c_dec_v = 2;
    y4m_ctx->dst_buf_read_sz =
        2 * (y4m_ctx->pic_w * y4m_ctx->pic_h +
             2 * ((y4m_ctx->pic_w + 1) / 2) * ((y4m_ctx->pic_h + 1) / 2));
    /* Natively supported: no conversion required. */
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_null;
    y4m_ctx->bit_depth = 10;
    y4m_ctx->bps = 15;
    y4m_ctx->aom_fmt = AOM_IMG_FMT_I42016;
    if (only_420) {
      fprintf(stderr, "Unsupported conversion from 420p10 to 420jpeg\n");
      return -1;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "420p12") == 0) {
    y4m_ctx->src_c_dec_h = 2;
    y4m_ctx->dst_c_dec_h = 2;
    y4m_ctx->src_c_dec_v = 2;
    y4m_ctx->dst_c_dec_v = 2;
    y4m_ctx->dst_buf_read_sz =
        2 * (y4m_ctx->pic_w * y4m_ctx->pic_h +
             2 * ((y4m_ctx->pic_w + 1) / 2) * ((y4m_ctx->pic_h + 1) / 2));
    /* Natively supported: no conversion required. */
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_null;
    y4m_ctx->bit_depth = 12;
    y4m_ctx->bps = 18;
    y4m_ctx->aom_fmt = AOM_IMG_FMT_I42016;
    if (only_420) {
      fprintf(stderr, "Unsupported conversion from 420p12 to 420jpeg\n");
      return -1;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "420paldv") == 0) {
    y4m_ctx->src_c_dec_h = y4m_ctx->dst_c_dec_h = y4m_ctx->src_c_dec_v =
        y4m_ctx->dst_c_dec_v = 2;
    y4m_ctx->dst_buf_read_sz = y4m_ctx->pic_w * y4m_ctx->pic_h;
    /*Chroma filter required: read into the aux buf first.
      We need to make two filter passes, so we need some extra space in the
       aux buffer.*/
    y4m_ctx->aux_buf_sz =
        3 * ((y4m_ctx->pic_w + 1) / 2) * ((y4m_ctx->pic_h + 1) / 2);
    y4m_ctx->aux_buf_read_sz =
        2 * ((y4m_ctx->pic_w + 1) / 2) * ((y4m_ctx->pic_h + 1) / 2);
    y4m_ctx->convert = y4m_convert_42xpaldv_42xjpeg;
  } else if (strcmp(y4m_ctx->chroma_type, "422jpeg") == 0) {
    y4m_ctx->src_c_dec_h = y4m_ctx->dst_c_dec_h = 2;
    y4m_ctx->src_c_dec_v = 1;
    y4m_ctx->dst_c_dec_v = 2;
    y4m_ctx->dst_buf_read_sz = y4m_ctx->pic_w * y4m_ctx->pic_h;
    /*Chroma filter required: read into the aux buf first.*/
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz =
        2 * ((y4m_ctx->pic_w + 1) / 2) * y4m_ctx->pic_h;
    y4m_ctx->convert = y4m_convert_422jpeg_420jpeg;
  } else if (strcmp(y4m_ctx->chroma_type, "422") == 0) {
    y4m_ctx->src_c_dec_h = 2;
    y4m_ctx->src_c_dec_v = 1;
    if (only_420) {
      y4m_ctx->dst_c_dec_h = 2;
      y4m_ctx->dst_c_dec_v = 2;
      y4m_ctx->dst_buf_read_sz = y4m_ctx->pic_w * y4m_ctx->pic_h;
      /*Chroma filter required: read into the aux buf first.
        We need to make two filter passes, so we need some extra space in the
         aux buffer.*/
      y4m_ctx->aux_buf_read_sz =
          2 * ((y4m_ctx->pic_w + 1) / 2) * y4m_ctx->pic_h;
      y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz +
                            ((y4m_ctx->pic_w + 1) / 2) * y4m_ctx->pic_h;
      y4m_ctx->convert = y4m_convert_422_420jpeg;
    } else {
      y4m_ctx->aom_fmt = AOM_IMG_FMT_I422;
      y4m_ctx->bps = 16;
      y4m_ctx->dst_c_dec_h = y4m_ctx->src_c_dec_h;
      y4m_ctx->dst_c_dec_v = y4m_ctx->src_c_dec_v;
      y4m_ctx->dst_buf_read_sz =
          y4m_ctx->pic_w * y4m_ctx->pic_h +
          2 * ((y4m_ctx->pic_w + 1) / 2) * y4m_ctx->pic_h;
      /*Natively supported: no conversion required.*/
      y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
      y4m_ctx->convert = y4m_convert_null;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "422p10") == 0) {
    y4m_ctx->src_c_dec_h = 2;
    y4m_ctx->src_c_dec_v = 1;
    y4m_ctx->aom_fmt = AOM_IMG_FMT_I42216;
    y4m_ctx->bps = 20;
    y4m_ctx->bit_depth = 10;
    y4m_ctx->dst_c_dec_h = y4m_ctx->src_c_dec_h;
    y4m_ctx->dst_c_dec_v = y4m_ctx->src_c_dec_v;
    y4m_ctx->dst_buf_read_sz =
        2 * (y4m_ctx->pic_w * y4m_ctx->pic_h +
             2 * ((y4m_ctx->pic_w + 1) / 2) * y4m_ctx->pic_h);
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_null;
    if (only_420) {
      fprintf(stderr, "Unsupported conversion from 422p10 to 420jpeg\n");
      return -1;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "422p12") == 0) {
    y4m_ctx->src_c_dec_h = 2;
    y4m_ctx->src_c_dec_v = 1;
    y4m_ctx->aom_fmt = AOM_IMG_FMT_I42216;
    y4m_ctx->bps = 24;
    y4m_ctx->bit_depth = 12;
    y4m_ctx->dst_c_dec_h = y4m_ctx->src_c_dec_h;
    y4m_ctx->dst_c_dec_v = y4m_ctx->src_c_dec_v;
    y4m_ctx->dst_buf_read_sz =
        2 * (y4m_ctx->pic_w * y4m_ctx->pic_h +
             2 * ((y4m_ctx->pic_w + 1) / 2) * y4m_ctx->pic_h);
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_null;
    if (only_420) {
      fprintf(stderr, "Unsupported conversion from 422p12 to 420jpeg\n");
      return -1;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "411") == 0) {
    y4m_ctx->src_c_dec_h = 4;
    y4m_ctx->dst_c_dec_h = 2;
    y4m_ctx->src_c_dec_v = 1;
    y4m_ctx->dst_c_dec_v = 2;
    y4m_ctx->dst_buf_read_sz = y4m_ctx->pic_w * y4m_ctx->pic_h;
    /*Chroma filter required: read into the aux buf first.
      We need to make two filter passes, so we need some extra space in the
       aux buffer.*/
    y4m_ctx->aux_buf_read_sz = 2 * ((y4m_ctx->pic_w + 3) / 4) * y4m_ctx->pic_h;
    y4m_ctx->aux_buf_sz =
        y4m_ctx->aux_buf_read_sz + ((y4m_ctx->pic_w + 1) / 2) * y4m_ctx->pic_h;
    y4m_ctx->convert = y4m_convert_411_420jpeg;
  } else if (strcmp(y4m_ctx->chroma_type, "444") == 0) {
    y4m_ctx->src_c_dec_h = 1;
    y4m_ctx->src_c_dec_v = 1;
    if (only_420) {
      y4m_ctx->dst_c_dec_h = 2;
      y4m_ctx->dst_c_dec_v = 2;
      y4m_ctx->dst_buf_read_sz = y4m_ctx->pic_w * y4m_ctx->pic_h;
      /*Chroma filter required: read into the aux buf first.
        We need to make two filter passes, so we need some extra space in the
         aux buffer.*/
      y4m_ctx->aux_buf_read_sz = 2 * y4m_ctx->pic_w * y4m_ctx->pic_h;
      y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz +
                            ((y4m_ctx->pic_w + 1) / 2) * y4m_ctx->pic_h;
      y4m_ctx->convert = y4m_convert_444_420jpeg;
    } else {
      y4m_ctx->aom_fmt = AOM_IMG_FMT_I444;
      y4m_ctx->bps = 24;
      y4m_ctx->dst_c_dec_h = y4m_ctx->src_c_dec_h;
      y4m_ctx->dst_c_dec_v = y4m_ctx->src_c_dec_v;
      y4m_ctx->dst_buf_read_sz = 3 * y4m_ctx->pic_w * y4m_ctx->pic_h;
      /*Natively supported: no conversion required.*/
      y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
      y4m_ctx->convert = y4m_convert_null;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "444p10") == 0) {
    y4m_ctx->src_c_dec_h = 1;
    y4m_ctx->src_c_dec_v = 1;
    y4m_ctx->aom_fmt = AOM_IMG_FMT_I44416;
    y4m_ctx->bps = 30;
    y4m_ctx->bit_depth = 10;
    y4m_ctx->dst_c_dec_h = y4m_ctx->src_c_dec_h;
    y4m_ctx->dst_c_dec_v = y4m_ctx->src_c_dec_v;
    y4m_ctx->dst_buf_read_sz = 2 * 3 * y4m_ctx->pic_w * y4m_ctx->pic_h;
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_null;
    if (only_420) {
      fprintf(stderr, "Unsupported conversion from 444p10 to 420jpeg\n");
      return -1;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "444p12") == 0) {
    y4m_ctx->src_c_dec_h = 1;
    y4m_ctx->src_c_dec_v = 1;
    y4m_ctx->aom_fmt = AOM_IMG_FMT_I44416;
    y4m_ctx->bps = 36;
    y4m_ctx->bit_depth = 12;
    y4m_ctx->dst_c_dec_h = y4m_ctx->src_c_dec_h;
    y4m_ctx->dst_c_dec_v = y4m_ctx->src_c_dec_v;
    y4m_ctx->dst_buf_read_sz = 2 * 3 * y4m_ctx->pic_w * y4m_ctx->pic_h;
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_null;
    if (only_420) {
      fprintf(stderr, "Unsupported conversion from 444p12 to 420jpeg\n");
      return -1;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "444alpha") == 0) {
    y4m_ctx->src_c_dec_h = 1;
    y4m_ctx->src_c_dec_v = 1;
    if (only_420) {
      y4m_ctx->dst_c_dec_h = 2;
      y4m_ctx->dst_c_dec_v = 2;
      y4m_ctx->dst_buf_read_sz = y4m_ctx->pic_w * y4m_ctx->pic_h;
      /*Chroma filter required: read into the aux buf first.
        We need to make two filter passes, so we need some extra space in the
         aux buffer.
        The extra plane also gets read into the aux buf.
        It will be discarded.*/
      y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz =
          3 * y4m_ctx->pic_w * y4m_ctx->pic_h;
      y4m_ctx->convert = y4m_convert_444_420jpeg;
    } else {
      fprintf(stderr, "Unsupported format: 444A\n");
      return -1;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "mono") == 0) {
    y4m_ctx->src_c_dec_h = y4m_ctx->src_c_dec_v = 0;
    y4m_ctx->dst_c_dec_h = y4m_ctx->dst_c_dec_v = 2;
    y4m_ctx->dst_buf_read_sz = y4m_ctx->pic_w * y4m_ctx->pic_h;
    /*No extra space required, but we need to clear the chroma planes.*/
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_mono_420jpeg;
  } else {
    fprintf(stderr, "Unknown chroma sampling type: %s\n", y4m_ctx->chroma_type);
    return -1;
  }
  /*The size of the final frame buffers is always computed from the
     destination chroma decimation type.*/
  y4m_ctx->dst_buf_sz =
      y4m_ctx->pic_w * y4m_ctx->pic_h +
      2 * ((y4m_ctx->pic_w + y4m_ctx->dst_c_dec_h - 1) / y4m_ctx->dst_c_dec_h) *
          ((y4m_ctx->pic_h + y4m_ctx->dst_c_dec_v - 1) / y4m_ctx->dst_c_dec_v);
  if (y4m_ctx->bit_depth == 8)
    y4m_ctx->dst_buf = (unsigned char *)malloc(y4m_ctx->dst_buf_sz);
  else
    y4m_ctx->dst_buf = (unsigned char *)malloc(2 * y4m_ctx->dst_buf_sz);
  if (!y4m_ctx->dst_buf) return -1;

  if (y4m_ctx->aux_buf_sz > 0) {
    y4m_ctx->aux_buf = (unsigned char *)malloc(y4m_ctx->aux_buf_sz);
    if (!y4m_ctx->aux_buf) {
      free(y4m_ctx->dst_buf);
      return -1;
    }
  }
  return 0;
}